

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O3

int DBGSetProcessAttached(CPalThread *pThread,HANDLE hProcess,BOOL bAttach)

{
  int iVar1;
  int iVar2;
  long in_FS_OFFSET;
  long *local_60;
  IPalObject *pobjProcess;
  IDataLock *pDataLock;
  CProcProcessLocalData *pLocalData;
  CAllowedObjectTypes aotProcess;
  
  aotProcess.m_rgfAllowedTypes._2_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  local_60 = (long *)0x0;
  pobjProcess = (IPalObject *)0x0;
  pDataLock = (IDataLock *)0x0;
  CorUnix::CAllowedObjectTypes::CAllowedObjectTypes
            ((CAllowedObjectTypes *)((long)&pLocalData + 6),otiProcess);
  iVar1 = (**(code **)(*CorUnix::g_pObjectManager + 0x28))
                    (CorUnix::g_pObjectManager,pThread,hProcess,
                     (CAllowedObjectTypes *)((long)&pLocalData + 6),0,&local_60);
  iVar2 = -1;
  if (iVar1 == 0) {
    iVar1 = (**(code **)(*local_60 + 0x18))(local_60,pThread,1,&pobjProcess,&pDataLock);
    if (iVar1 == 0) {
      iVar2 = *(int *)((long)&pDataLock[1]._vptr_IDataLock + 4);
      if (bAttach == 0) {
        iVar2 = iVar2 + -1;
        *(int *)((long)&pDataLock[1]._vptr_IDataLock + 4) = iVar2;
        if (iVar2 < 0) {
          fprintf(_stderr,"] %s %s:%d","DBGSetProcessAttached",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/debug/debug.cpp"
                  ,0x61c);
          fprintf(_stderr,"pLocalData->lAttachCount < 0 check for extra DBGDetachProcess calls\n");
          iVar2 = -1;
        }
      }
      else {
        iVar2 = iVar2 + 1;
        *(int *)((long)&pDataLock[1]._vptr_IDataLock + 4) = iVar2;
      }
    }
  }
  if (pobjProcess != (IPalObject *)0x0) {
    (**pobjProcess->_vptr_IPalObject)(pobjProcess,pThread,1);
  }
  if (local_60 != (long *)0x0) {
    (**(code **)(*local_60 + 0x40))(local_60,pThread);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == aotProcess.m_rgfAllowedTypes._2_8_) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

static int
DBGSetProcessAttached(
    CPalThread *pThread,
    HANDLE hProcess,
    BOOL  bAttach
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjProcess = NULL;
    IDataLock *pDataLock = NULL;
    CProcProcessLocalData *pLocalData = NULL;
    int ret = -1;
    CAllowedObjectTypes aotProcess(otiProcess);

    palError = g_pObjectManager->ReferenceObjectByHandle(
        pThread,
        hProcess,
        &aotProcess,
        0,
        &pobjProcess
        );

    if (NO_ERROR != palError)
    {
        goto DBGSetProcessAttachedExit;
    }

    palError = pobjProcess->GetProcessLocalData(
        pThread,
        WriteLock,
        &pDataLock,
        reinterpret_cast<void **>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        goto DBGSetProcessAttachedExit;
    }

    if (bAttach)
    {
        pLocalData->lAttachCount += 1;
    }
    else
    {
        pLocalData->lAttachCount -= 1;

        if (pLocalData->lAttachCount < 0)
        {
            ASSERT("pLocalData->lAttachCount < 0 check for extra DBGDetachProcess calls\n");
            palError = ERROR_INTERNAL_ERROR;
            goto DBGSetProcessAttachedExit;
        }
    }

    ret = pLocalData->lAttachCount;

DBGSetProcessAttachedExit:

    if (NULL != pDataLock)
    {
        pDataLock->ReleaseLock(pThread, TRUE);
    }

    if (NULL != pobjProcess)
    {
        pobjProcess->ReleaseReference(pThread);
    }

    return ret;
}